

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runsuite.c
# Opt level: O3

int xsdTestSuite(xmlNodePtr cur)

{
  xmlXPathContextPtr_conflict pxVar1;
  int iVar2;
  undefined4 uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  xmlChar *pxVar7;
  xmlNodePtr cur_00;
  xmlNodePtr pxVar8;
  xmlNodePtr pxVar9;
  undefined8 uVar10;
  xmlNodePtr pxVar11;
  long lVar12;
  long lVar13;
  int *piVar14;
  long lVar15;
  char *pcVar16;
  long lVar17;
  
  if ((verbose == '\x01') &&
     (pxVar7 = getString(cur,"string(documentation)"), pxVar7 != (xmlChar *)0x0)) {
    printf("Suite %s\n",pxVar7);
    (*_xmlFree)(pxVar7);
  }
  cur_00 = getNext(cur,"./testCase[1]");
  if (cur_00 != (xmlNodePtr)0x0) {
    do {
      if (0 < nb_entities) {
        lVar15 = 0;
        lVar17 = 0;
        do {
          if (*(long *)((long)testEntitiesName + lVar15) != 0) {
            (*_xmlFree)();
          }
          if (*(long *)((long)testEntitiesValue + lVar15) != 0) {
            (*_xmlFree)();
          }
          lVar17 = lVar17 + 1;
          lVar15 = lVar15 + 8;
        } while (lVar17 < nb_entities);
      }
      nb_entities = 0;
      testErrorsSize = 0;
      testErrors[0] = '\0';
      pxVar8 = getNext(cur_00,"./dir[1]");
      if (pxVar8 != (xmlNodePtr)0x0) {
        installDirs(pxVar8,(xmlChar *)0x0);
      }
      pxVar8 = getNext(cur_00,"./resource[1]");
      if (pxVar8 != (xmlNodePtr)0x0) {
        installResources(pxVar8,(xmlChar *)0x0);
      }
      pxVar8 = getNext(cur_00,"./correct[1]");
      if (pxVar8 == (xmlNodePtr)0x0) {
        pxVar8 = getNext(cur_00,"./incorrect[1]");
        if (pxVar8 != (xmlNodePtr)0x0) {
          pcVar16 = "./*";
          pxVar11 = pxVar8;
          pxVar9 = getNext(pxVar8,"./*");
          if (pxVar9 == (xmlNodePtr)0x0) {
            uVar10 = xmlGetLineNo(pxVar8);
            test_log("Failed to find test in correct line %ld\n",uVar10);
          }
          else {
            iVar2 = xmlMemUsed();
            lVar15 = xmlBufferCreate();
            if (lVar15 == 0) goto LAB_001040f0;
            xmlBufferSetAllocationScheme(lVar15,0);
            xmlNodeDump(lVar15,pxVar9->doc,pxVar9,0,0);
            uVar10 = xmlBufferContent(lVar15);
            uVar3 = xmlBufferLength(lVar15);
            uVar10 = xmlRelaxNGNewMemParserCtxt(uVar10,uVar3);
            xmlRelaxNGSetParserErrors(uVar10,testErrorHandler);
            xmlRelaxNGSetResourceLoader(uVar10,testResourceLoader,0);
            lVar17 = xmlRelaxNGParse(uVar10);
            xmlRelaxNGFreeParserCtxt(uVar10);
            if (lVar17 == 0) {
              xmlBufferFree(lVar15);
            }
            else {
              uVar10 = xmlGetLineNo(pxVar9);
              test_log("Failed to detect incorrect RNG line %ld\n",uVar10);
              xmlBufferFree(lVar15);
              xmlRelaxNGFree(lVar17);
            }
            xmlResetLastError();
            iVar4 = xmlMemUsed();
            if (iVar2 != iVar4) {
              uVar10 = xmlGetLineNo(pxVar8);
              iVar4 = xmlMemUsed();
              uVar6 = iVar4 - iVar2;
              goto LAB_00104037;
            }
          }
        }
      }
      else {
        pcVar16 = "./*";
        pxVar11 = pxVar8;
        pxVar9 = getNext(pxVar8,"./*");
        if (pxVar9 == (xmlNodePtr)0x0) {
          xsdTestSuite_cold_4();
        }
        else {
          iVar2 = xmlMemUsed();
          lVar15 = xmlBufferCreate();
          if (lVar15 == 0) {
            xsdTestSuite_cold_3();
LAB_001040f0:
            xsdTestSuite_cold_5();
            pxVar1 = ctxtXPath;
            if (pcVar16 != (char *)0x0 && pxVar11->doc != (xmlDocPtr)0x0) {
              ctxtXPath->doc = pxVar11->doc;
              pxVar1->node = pxVar11;
              lVar15 = xmlXPathCompile(pcVar16);
              if (lVar15 == 0) {
                fprintf(_stderr,"Failed to compile %s\n",pcVar16);
                return 0;
              }
              piVar14 = (int *)xmlXPathCompiledEval(lVar15,ctxtXPath);
              xmlXPathFreeCompExpr(lVar15);
              if (piVar14 != (int *)0x0) {
                if (*piVar14 == 4) {
                  iVar2 = (int)*(undefined8 *)(piVar14 + 8);
                  piVar14[8] = 0;
                  piVar14[9] = 0;
                }
                else {
                  iVar2 = 0;
                }
                xmlXPathFreeObject(piVar14);
                return iVar2;
              }
            }
            return 0;
          }
          xmlBufferSetAllocationScheme(lVar15,0);
          xmlNodeDump(lVar15,pxVar9->doc,pxVar9,0,0);
          uVar10 = xmlBufferContent(lVar15);
          uVar3 = xmlBufferLength(lVar15);
          uVar10 = xmlRelaxNGNewMemParserCtxt(uVar10,uVar3);
          xmlRelaxNGSetParserErrors(uVar10,testErrorHandler,testErrorHandler,uVar10);
          xmlRelaxNGSetResourceLoader(uVar10,testResourceLoader,0);
          lVar17 = xmlRelaxNGParse(uVar10);
          xmlRelaxNGFreeParserCtxt(uVar10);
          if (lVar17 == 0) {
            uVar10 = xmlGetLineNo(pxVar9);
            test_log("Failed to parse RNGtest line %ld\n",uVar10);
            nb_errors = nb_errors + 1;
            xmlBufferFree(lVar15);
          }
          else {
            for (pxVar11 = getNext(pxVar8,"following-sibling::valid[1]"); pxVar11 != (xmlNodePtr)0x0
                ; pxVar11 = getNext(pxVar11,"following-sibling::valid[1]")) {
              lVar12 = xmlGetProp(pxVar11,"dtd");
              pxVar9 = getNext(pxVar11,"./*");
              if (pxVar9 == (xmlNodePtr)0x0) {
                xsdTestSuite_cold_1();
              }
              else {
                xmlBufferEmpty(lVar15);
                if (lVar12 != 0) {
                  xmlBufferAdd(lVar15,lVar12,0xffffffff);
                }
                xmlNodeDump(lVar15,pxVar9->doc,pxVar9,0,0);
                iVar4 = xmlMemUsed();
                uVar10 = xmlBufferContent(lVar15);
                uVar3 = xmlBufferLength(lVar15);
                lVar13 = xmlReadMemory(uVar10,uVar3,"test");
                if (lVar13 == 0) {
                  uVar10 = xmlGetLineNo(pxVar11);
                  test_log("Failed to parse valid instance line %ld\n",uVar10);
                  nb_errors = nb_errors + 1;
                }
                else {
                  nb_tests = nb_tests + 1;
                  uVar10 = xmlRelaxNGNewValidCtxt(lVar17);
                  xmlRelaxNGSetValidErrors(uVar10,testErrorHandler);
                  iVar5 = xmlRelaxNGValidateDoc(uVar10,lVar13);
                  xmlRelaxNGFreeValidCtxt(uVar10);
                  pcVar16 = "Failed to validate valid instance line %ld\n";
                  if ((0 < iVar5) ||
                     (pcVar16 = "Internal error validating instance line %ld\n", iVar5 < 0)) {
                    uVar10 = xmlGetLineNo(pxVar11);
                    test_log(pcVar16,uVar10);
                    nb_errors = nb_errors + 1;
                  }
                  xmlFreeDoc(lVar13);
                }
                xmlResetLastError();
                iVar5 = xmlMemUsed();
                if (iVar4 != iVar5) {
                  uVar10 = xmlGetLineNo(pxVar11);
                  iVar5 = xmlMemUsed();
                  test_log("Validation of instance line %ld leaked %d\n",uVar10,
                           (ulong)(uint)(iVar5 - iVar4));
                  nb_leaks = nb_leaks + 1;
                }
              }
              if (lVar12 != 0) {
                (*_xmlFree)(lVar12);
              }
            }
            for (pxVar11 = getNext(pxVar8,"following-sibling::invalid[1]");
                pxVar11 != (xmlNodePtr)0x0;
                pxVar11 = getNext(pxVar11,"following-sibling::invalid[1]")) {
              pxVar9 = getNext(pxVar11,"./*");
              if (pxVar9 == (xmlNodePtr)0x0) {
                xsdTestSuite_cold_2();
              }
              else {
                xmlBufferEmpty(lVar15);
                xmlNodeDump(lVar15,pxVar9->doc,pxVar9,0,0);
                iVar4 = xmlMemUsed();
                uVar10 = xmlBufferContent(lVar15);
                uVar3 = xmlBufferLength(lVar15);
                lVar12 = xmlReadMemory(uVar10,uVar3,"test");
                if (lVar12 == 0) {
                  uVar10 = xmlGetLineNo(pxVar11);
                  test_log("Failed to parse valid instance line %ld\n",uVar10);
                  nb_errors = nb_errors + 1;
                }
                else {
                  nb_tests = nb_tests + 1;
                  uVar10 = xmlRelaxNGNewValidCtxt(lVar17);
                  xmlRelaxNGSetValidErrors(uVar10,testErrorHandler);
                  iVar5 = xmlRelaxNGValidateDoc(uVar10,lVar12);
                  xmlRelaxNGFreeValidCtxt(uVar10);
                  pcVar16 = "Failed to detect invalid instance line %ld\n";
                  if ((iVar5 == 0) ||
                     (pcVar16 = "Internal error validating instance line %ld\n", iVar5 < 0)) {
                    uVar10 = xmlGetLineNo(pxVar11);
                    test_log(pcVar16,uVar10);
                    nb_errors = nb_errors + 1;
                  }
                  xmlFreeDoc(lVar12);
                }
                xmlResetLastError();
                iVar5 = xmlMemUsed();
                if (iVar4 != iVar5) {
                  uVar10 = xmlGetLineNo(pxVar11);
                  iVar5 = xmlMemUsed();
                  test_log("Validation of instance line %ld leaked %d\n",uVar10,
                           (ulong)(uint)(iVar5 - iVar4));
                  nb_leaks = nb_leaks + 1;
                }
              }
            }
            xmlBufferFree(lVar15);
            xmlRelaxNGFree(lVar17);
          }
          xmlResetLastError();
          iVar4 = xmlMemUsed();
          if (iVar2 != 0 && iVar2 != iVar4) {
            uVar10 = xmlGetLineNo(pxVar8);
            iVar4 = xmlMemUsed();
            uVar6 = iVar4 - iVar2;
LAB_00104037:
            test_log("Validation of tests starting line %ld leaked %d\n",uVar10,(ulong)uVar6);
            nb_leaks = nb_leaks + 1;
          }
        }
      }
      cur_00 = getNext(cur_00,"following-sibling::testCase[1]");
    } while (cur_00 != (xmlNodePtr)0x0);
    cur_00 = (xmlNodePtr)0x0;
  }
  return (int)cur_00;
}

Assistant:

static int
xsdTestSuite(xmlNodePtr cur) {
    if (verbose) {
	xmlChar *doc = getString(cur, "string(documentation)");

	if (doc != NULL) {
	    printf("Suite %s\n", doc);
	    xmlFree(doc);
	}
    }
    cur = getNext(cur, "./testCase[1]");
    while (cur != NULL) {
        xsdTestCase(cur);
	cur = getNext(cur, "following-sibling::testCase[1]");
    }

    return(0);
}